

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

cmCPackComponent * __thiscall
cmCPackIFWGenerator::GetComponent
          (cmCPackIFWGenerator *this,string *projectName,string *componentName)

{
  PackagesMap *this_00;
  cmCPackLog *this_01;
  int iVar1;
  iterator iVar2;
  cmCPackComponent *component;
  iterator iVar3;
  mapped_type *this_02;
  ostream *poVar4;
  _Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
  *this_03;
  cmCPackIFWPackage *package;
  string name;
  char *local_1b8 [4];
  ostringstream cmCPackLog_msg;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
          ::find(&(this->super_cmCPackGenerator).Components._M_t,componentName);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header) {
    component = cmCPackGenerator::GetComponent
                          (&this->super_cmCPackGenerator,projectName,componentName);
    if (component == (cmCPackComponent *)0x0) {
      component = (cmCPackComponent *)0x0;
    }
    else {
      GetComponentPackageName_abi_cxx11_(&name,this,component);
      this_00 = &this->Packages;
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
              ::find(&this_00->_M_t,&name);
      if ((_Rb_tree_header *)iVar3._M_node == &(this->Packages)._M_t._M_impl.super__Rb_tree_header)
      {
        this_02 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                  ::operator[](this_00,&name);
        package = this_02;
        std::__cxx11::string::_M_assign((string *)&this_02->Name);
        this_02->Generator = this;
        iVar1 = cmCPackIFWPackage::ConfigureFromComponent(this_02,component);
        if (iVar1 == 0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
          ::erase(&this_00->_M_t,&name);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Cannot configure package \"");
          poVar4 = std::operator<<(poVar4,(string *)&name);
          poVar4 = std::operator<<(poVar4,"\" for component \"");
          poVar4 = std::operator<<(poVar4,(string *)component);
          poVar4 = std::operator<<(poVar4,"\"");
          std::endl<char,std::char_traits<char>>(poVar4);
          this_01 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(this_01,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                          ,0x1ad,local_1b8[0]);
          std::__cxx11::string::~string((string *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        }
        else {
          this_02->Installer = &this->Installer;
          std::__cxx11::string::string((string *)&cmCPackLog_msg,(string *)&name);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,cmCPackIFWPackage*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>>
                      *)&(this->Installer).Packages,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>
                      *)&cmCPackLog_msg);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          _cmCPackLog_msg = (pointer)component;
          std::
          _Rb_tree<cmCPackComponent*,std::pair<cmCPackComponent*const,cmCPackIFWPackage*>,std::_Select1st<std::pair<cmCPackComponent*const,cmCPackIFWPackage*>>,std::less<cmCPackComponent*>,std::allocator<std::pair<cmCPackComponent*const,cmCPackIFWPackage*>>>
          ::_M_emplace_unique<std::pair<cmCPackComponent*,cmCPackIFWPackage*>>
                    ((_Rb_tree<cmCPackComponent*,std::pair<cmCPackComponent*const,cmCPackIFWPackage*>,std::_Select1st<std::pair<cmCPackComponent*const,cmCPackIFWPackage*>>,std::less<cmCPackComponent*>,std::allocator<std::pair<cmCPackComponent*const,cmCPackIFWPackage*>>>
                      *)&this->ComponentPackages,
                     (pair<cmCPackComponent_*,_cmCPackIFWPackage_*> *)&cmCPackLog_msg);
          this_03 = (_Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
                     *)&this->BinaryPackages;
          if ((component->field_0x48 & 8) != 0) {
            this_03 = (_Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
                       *)&this->DownloadedPackages;
          }
          std::
          _Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
          ::_M_insert_unique<cmCPackIFWPackage*const&>(this_03,&package);
        }
      }
      std::__cxx11::string::~string((string *)&name);
    }
  }
  else {
    component = (cmCPackComponent *)(iVar2._M_node + 2);
  }
  return component;
}

Assistant:

cmCPackComponent*
cmCPackIFWGenerator::GetComponent(const std::string &projectName,
                                  const std::string &componentName)
{
  ComponentsMap::iterator cit = Components.find(componentName);
  if ( cit != Components.end() ) return &(cit->second);

  cmCPackComponent* component
    = cmCPackGenerator::GetComponent(projectName, componentName);
  if(!component) return component;

  std::string name = GetComponentPackageName(component);
  PackagesMap::iterator pit = Packages.find(name);
  if(pit != Packages.end()) return component;

  cmCPackIFWPackage *package = &Packages[name];
  package->Name = name;
  package->Generator = this;
  if(package->ConfigureFromComponent(component))
    {
    package->Installer = &Installer;
    Installer.Packages.insert(
      std::pair<std::string, cmCPackIFWPackage*>(
        name, package));
    ComponentPackages.insert(
      std::pair<cmCPackComponent*, cmCPackIFWPackage*>(
        component, package));
    if(component->IsDownloaded)
      {
      DownloadedPackages.insert(package);
      }
    else
      {
      BinaryPackages.insert(package);
      }
    }
  else
    {
    Packages.erase(name);
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot configure package \"" << name <<
                  "\" for component \"" << component->Name << "\""
                  << std::endl);
    }

  return component;
}